

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpsdespacket.h
# Opt level: O0

uint8_t * __thiscall jrtplib::RTCPSDESPacket::GetPRIVValueData(RTCPSDESPacket *this)

{
  uint8_t *puVar1;
  ulong uVar2;
  size_t valuelen;
  size_t prefixlength;
  uint8_t *preflen;
  RTCPSDESHeader *sdeshdr;
  RTCPSDESPacket *this_local;
  
  if (((this->super_RTCPPacket).knownformat & 1U) == 0) {
    this_local = (RTCPSDESPacket *)0x0;
  }
  else if (this->currentchunk == (uint8_t *)0x0) {
    this_local = (RTCPSDESPacket *)0x0;
  }
  else {
    puVar1 = this->currentchunk + this->itemoffset;
    if (*puVar1 == '\b') {
      if (puVar1[1] == '\0') {
        this_local = (RTCPSDESPacket *)0x0;
      }
      else {
        uVar2 = (ulong)this->currentchunk[this->itemoffset + 2];
        if ((ulong)(long)(int)(puVar1[1] - 1) < uVar2) {
          this_local = (RTCPSDESPacket *)0x0;
        }
        else if (puVar1[1] - uVar2 == 1) {
          this_local = (RTCPSDESPacket *)0x0;
        }
        else {
          this_local = (RTCPSDESPacket *)(this->currentchunk + uVar2 + this->itemoffset + 3);
        }
      }
    }
    else {
      this_local = (RTCPSDESPacket *)0x0;
    }
  }
  return (uint8_t *)this_local;
}

Assistant:

inline uint8_t *RTCPSDESPacket::GetPRIVValueData()
{
	if (!knownformat)
		return 0;
	if (currentchunk == 0)
		return 0;
	RTCPSDESHeader *sdeshdr = (RTCPSDESHeader *)(currentchunk+itemoffset);
	if (sdeshdr->sdesid != RTCP_SDES_ID_PRIVATE)
		return 0;
	if (sdeshdr->length == 0)
		return 0;
	uint8_t *preflen = currentchunk+itemoffset+sizeof(RTCPSDESHeader);
	size_t prefixlength = (size_t)(*preflen);
	if (prefixlength > (size_t)((sdeshdr->length)-1))
		return 0;
	size_t valuelen = ((size_t)(sdeshdr->length))-prefixlength-1;
	if (valuelen == 0)
		return 0;
	return (currentchunk+itemoffset+sizeof(RTCPSDESHeader)+1+prefixlength);
}